

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aeskey.c
# Opt level: O0

int aes_encrypt_key(uchar *key,int key_len,aes_encrypt_ctx *cx)

{
  int iVar1;
  aes_encrypt_ctx *cx_local;
  int key_len_local;
  uchar *key_local;
  
  if (key_len == 0x10) {
LAB_003804d8:
    key_local._4_4_ = aes_encrypt_key128(key,cx);
  }
  else {
    if (key_len == 0x18) {
LAB_003804ea:
      iVar1 = aes_encrypt_key192(key,cx);
      return iVar1;
    }
    if (key_len != 0x20) {
      if (key_len == 0x80) goto LAB_003804d8;
      if (key_len == 0xc0) goto LAB_003804ea;
      if (key_len != 0x100) {
        return 1;
      }
    }
    key_local._4_4_ = aes_encrypt_key256(key,cx);
  }
  return key_local._4_4_;
}

Assistant:

AES_RETURN aes_encrypt_key(const unsigned char *key, int key_len, aes_encrypt_ctx cx[1])
{
	switch(key_len)
	{
	case 16: case 128: return aes_encrypt_key128(key, cx);
	case 24: case 192: return aes_encrypt_key192(key, cx);
	case 32: case 256: return aes_encrypt_key256(key, cx);
	default: return EXIT_FAILURE;
	}
}